

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

bool __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::RowIsValid
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this,idx_t row_idx)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long *plVar4;
  ulong uVar5;
  idx_t iVar6;
  bool bVar7;
  
  lVar2 = *(long *)(this->args + 8) - *(long *)this->args;
  if (lVar2 == 0) {
    bVar7 = true;
  }
  else {
    lVar2 = lVar2 >> 3;
    uVar3 = lVar2 * 0x4ec4ec4ec4ec4ec5;
    bVar7 = false;
    plVar4 = (long *)&this->field_0x18;
    uVar5 = 1;
    do {
      iVar6 = row_idx;
      if (*(long *)plVar4[-2] != 0) {
        iVar6 = (idx_t)*(uint *)(*(long *)plVar4[-2] + row_idx * 4);
      }
      if ((*plVar4 != 0) && ((*(ulong *)(*plVar4 + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) == 0)) {
        return bVar7;
      }
      bVar7 = uVar3 <= uVar5;
      lVar1 = (lVar2 * -0x4ec4ec4ec4ec4ec5 - (ulong)(uVar3 == 0)) + uVar5;
      uVar5 = uVar5 + 1;
      plVar4 = plVar4 + 9;
    } while (lVar1 != 0);
  }
  return bVar7;
}

Assistant:

bool RowIsValid(idx_t row_idx) {
		for (idx_t i = 0; i < args.ColumnCount(); i++) {
			auto idx = vdata[i].sel->get_index(row_idx);
			if (!vdata[i].validity.RowIsValid(idx)) {
				return false;
			}
		}
		return true;
	}